

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2607:23)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2607:23)>
          *this,ExceptionOrValue *output)

{
  ReadResult actual;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_388;
  NullableValue<kj::Exception> local_370;
  char local_1d8;
  size_t local_1d0;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> local_1c0;
  
  local_370.isSet = false;
  local_1d8 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_370);
  if (local_370.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1c0,&local_370.field_1.value);
    local_1c0.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> *)
               output,&local_1c0);
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_1c0);
  }
  else if (local_1d8 == '\x01') {
    actual.capCount = local_1d0;
    actual.byteCount = (size_t)&this->func;
    anon_class_16_1_6971b95b_for_func::operator()
              ((anon_class_16_1_6971b95b_for_func *)&local_388,actual);
    local_1c0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1c0.value.ptr.isSet = true;
    local_1c0.value.ptr.field_1.value.ptr.disposer = local_388.disposer;
    local_1c0.value.ptr.field_1.value.ptr.ptr = local_388.ptr;
    local_388.ptr = (AsyncCapabilityStream *)0x0;
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> *)
               output,&local_1c0);
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_1c0);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_388);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_370);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }